

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

float * Abc_NtkGetCiArrivalFloats(Abc_Ntk_t *pNtk)

{
  float fVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long *plVar4;
  float *pfVar5;
  float *pfVar6;
  size_t sVar7;
  size_t __nmemb;
  float fVar8;
  
  pVVar2 = pNtk->vCis;
  __nmemb = (size_t)pVVar2->nSize;
  pfVar6 = (float *)calloc(__nmemb,4);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0 && 0 < (long)__nmemb) {
    ppvVar3 = pVVar2->pArray;
    sVar7 = 0;
    do {
      plVar4 = (long *)ppvVar3[sVar7];
      pfVar5 = *(float **)
                (*(long *)(*(long *)(*(long *)(*plVar4 + 0x108) + 0x10) + 8) +
                (long)(int)plVar4[2] * 8);
      fVar8 = *pfVar5;
      fVar1 = pfVar5[1];
      if (fVar8 <= fVar1) {
        fVar8 = fVar1;
      }
      pfVar6[sVar7] = fVar8;
      sVar7 = sVar7 + 1;
    } while (__nmemb != sVar7);
  }
  return pfVar6;
}

Assistant:

float * Abc_NtkGetCiArrivalFloats( Abc_Ntk_t * pNtk )
{
    float * p;
    Abc_Obj_t * pNode;
    int i;
    p = ABC_CALLOC( float, Abc_NtkCiNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        return p;
    // set the PI arrival times
    Abc_NtkForEachCi( pNtk, pNode, i )
        p[i] = Abc_NodeReadArrivalWorst(pNode);
    return p;
}